

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall
helics::apps::Recorder::captureForCurrentTime(Recorder *this,Time currentTime,int iteration)

{
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  bool bVar1;
  int16_t iVar2;
  mapped_type *pmVar3;
  reference pvVar4;
  size_type sVar5;
  string *psVar6;
  reference pvVar7;
  pointer pMVar8;
  size_t sVar9;
  pointer pMVar10;
  int in_EDX;
  long in_RDI;
  string_view sVar11;
  string messstr;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> mess;
  Endpoint *ept;
  iterator __end2_1;
  iterator __begin2_1;
  deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *__range2_1;
  string valstr;
  int subId;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  Input *sub;
  iterator __end2;
  iterator __begin2;
  deque<helics::Input,_std::allocator<helics::Input>_> *__range2;
  Input *in_stack_fffffffffffff7d8;
  Endpoint *in_stack_fffffffffffff7e0;
  Input *in_stack_fffffffffffff7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f0;
  TimeRepresentation<count_time<9,_long>_> *in_stack_fffffffffffff7f8;
  vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
  *in_stack_fffffffffffff800;
  key_type *in_stack_fffffffffffff818;
  map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
  *in_stack_fffffffffffff820;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff830;
  undefined1 local_770 [16];
  double local_760;
  _Alloc_hider local_758;
  size_type local_750;
  undefined1 local_748 [32];
  string_view local_728;
  _Alloc_hider local_718;
  char *local_710;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_708 [5];
  reference local_6b8;
  _Self local_6b0;
  _Self local_690;
  long local_670;
  size_type local_668;
  double local_660;
  char *local_658;
  undefined8 local_650;
  undefined1 local_648 [32];
  size_type local_628;
  double local_620;
  char *local_618;
  undefined8 local_610;
  undefined1 local_608 [32];
  double local_5e8;
  char *local_5e0;
  undefined8 local_5d8;
  undefined1 local_5d0 [16];
  format_args in_stack_fffffffffffffa40;
  char *in_stack_fffffffffffffa50;
  char *in_stack_fffffffffffffa58;
  undefined1 local_598 [80];
  BaseType local_548;
  mapped_type local_544;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  reference local_520;
  _Self local_518;
  _Self local_4f8;
  long local_4d8;
  int local_4cc [5];
  char *local_4b8 [2];
  undefined1 local_4a8 [48];
  undefined8 local_478;
  char **local_470;
  char *local_468;
  undefined8 uStack_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_450;
  string *local_448;
  int *local_440;
  undefined1 *local_438;
  char *local_430;
  undefined8 uStack_428;
  undefined1 *local_420;
  double local_418 [6];
  undefined8 local_3e8;
  double *local_3e0;
  char *local_3d8;
  undefined8 uStack_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3c8;
  string *local_3c0;
  double *local_3b8;
  char *local_3b0;
  undefined8 uStack_3a8;
  undefined1 *local_3a0;
  double local_398 [2];
  undefined1 local_388 [32];
  size_type local_368 [2];
  undefined8 local_358;
  double *local_350;
  char *local_348;
  undefined8 uStack_340;
  size_type *local_330;
  string *local_328;
  int *local_320;
  double *local_318;
  char *local_310;
  undefined8 uStack_308;
  undefined1 *local_300;
  double local_2f8 [4];
  size_type local_2d8 [2];
  undefined8 local_2c8;
  double *local_2c0;
  char *local_2b8;
  undefined8 uStack_2b0;
  size_type *local_2a8;
  string *local_2a0;
  double *local_298;
  char *local_290;
  undefined8 uStack_288;
  undefined1 *local_280;
  pointer local_278 [8];
  undefined8 local_238;
  pointer *local_230;
  char *local_228;
  size_type sStack_220;
  string_view *local_210;
  string *local_208;
  string *local_200;
  _Alloc_hider *local_1f8;
  char *local_1f0;
  size_type sStack_1e8;
  char *local_1e0;
  double local_1d8 [6];
  undefined8 local_1a8 [2];
  undefined8 local_198;
  double *local_190;
  char *local_188;
  size_type sStack_180;
  undefined8 *local_178;
  string *local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  double *local_160;
  char *local_158;
  size_type sStack_150;
  undefined1 *local_148;
  double local_140;
  double *local_138;
  pointer local_130;
  pointer *local_128;
  double local_120;
  double *local_118;
  double local_110;
  double *local_108;
  double local_100;
  double *local_f8;
  char *local_f0;
  char **local_e8;
  undefined1 *local_d8;
  undefined1 *local_c8;
  char **local_c0;
  undefined8 *local_b8;
  double *local_b0;
  undefined8 *local_a8;
  undefined8 local_a0;
  undefined8 *local_98;
  size_type local_90;
  size_type *local_88;
  size_type local_80;
  size_type *local_78;
  double *local_70;
  undefined8 *local_68;
  size_type local_60;
  size_type *local_58;
  size_type local_50;
  size_type *local_48;
  undefined8 local_40;
  undefined8 *local_38;
  double *local_30;
  undefined8 *local_28;
  pointer *local_20;
  undefined8 *local_18;
  double *local_10;
  undefined8 *local_8;
  
  local_4d8 = in_RDI + 0xd0;
  local_4cc[0] = in_EDX;
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::begin
            ((deque<helics::Input,_std::allocator<helics::Input>_> *)in_stack_fffffffffffff7d8);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::end
            ((deque<helics::Input,_std::allocator<helics::Input>_> *)in_stack_fffffffffffff7d8);
  while (bVar1 = CLI::std::operator==(&local_4f8,&local_518), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_520 = CLI::std::_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*>::
                operator*(&local_4f8);
    bVar1 = Input::isUpdated(in_stack_fffffffffffff7d8);
    if (bVar1) {
      Input::getValue<std::__cxx11::string>(in_stack_fffffffffffff7e8);
      local_548 = (BaseType)Interface::getHandle(&local_520->super_Interface);
      pmVar3 = CLI::std::
               map<helics::InterfaceHandle,_int,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_int>_>_>
               ::operator[](in_stack_fffffffffffff820,in_stack_fffffffffffff818);
      local_544 = *pmVar3;
      std::
      vector<helics::apps::Recorder::ValueCapture,std::allocator<helics::apps::Recorder::ValueCapture>>
      ::emplace_back<TimeRepresentation<count_time<9,long>>&,int_const&,std::__cxx11::string&>
                (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8,
                 (int *)in_stack_fffffffffffff7f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff7e8);
      if (0 < local_4cc[0]) {
        iVar2 = (int16_t)local_4cc[0];
        pvVar4 = CLI::std::
                 vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
                 ::back((vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
                         *)in_stack_fffffffffffff7e0);
        pvVar4->iteration = iVar2;
      }
      if ((*(byte *)(in_RDI + 0xa1) & 1) != 0) {
        std::__cxx11::string::string(in_stack_fffffffffffff7f0);
        sVar5 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                ::size(&local_540);
        if (sVar5 < 0x96) {
          if (local_4cc[0] < 1) {
            local_5e0 = "[{}]value {}={}";
            local_5d8 = 0xf;
            local_5e8 = TimeRepresentation::operator_cast_to_double
                                  ((TimeRepresentation<count_time<9,_long>_> *)0x211e9e);
            local_3c0 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffff7e0);
            local_3a0 = local_5d0;
            local_3b0 = local_5e0;
            uStack_3a8 = local_5d8;
            local_3b8 = &local_5e8;
            local_3c8 = &local_540;
            local_3d8 = local_5e0;
            uStack_3d0 = local_5d8;
            local_100 = local_5e8;
            local_f8 = local_418;
            local_418[0] = local_5e8;
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffff7f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7e8);
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffff7f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7e8);
            local_a8 = &local_3e8;
            local_b0 = local_418;
            local_3e8 = 0xdda;
            fmt_00.size_ = (size_t)in_stack_fffffffffffffa58;
            fmt_00.data_ = in_stack_fffffffffffffa50;
            local_3e0 = local_b0;
            ::fmt::v11::vformat_abi_cxx11_(fmt_00,in_stack_fffffffffffffa40);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7e0);
          }
          else {
            in_stack_fffffffffffffa58 = "[{}:{}]value {}={}";
            in_stack_fffffffffffffa50 =
                 (char *)TimeRepresentation::operator_cast_to_double
                                   ((TimeRepresentation<count_time<9,_long>_> *)0x211c83);
            local_448 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffff7e0);
            local_420 = local_598;
            uStack_428 = 0x12;
            local_438 = &stack0xfffffffffffffa50;
            local_440 = local_4cc;
            local_450 = &local_540;
            uStack_460 = 0x12;
            local_e8 = local_4b8;
            local_c8 = local_4a8;
            local_468 = in_stack_fffffffffffffa58;
            local_430 = in_stack_fffffffffffffa58;
            local_f0 = in_stack_fffffffffffffa50;
            local_4b8[0] = in_stack_fffffffffffffa50;
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffff7f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7e8);
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffff7f0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7e8);
            local_b8 = &local_478;
            local_c0 = local_4b8;
            local_478 = 0xdd1a;
            fmt.size_ = (size_t)in_stack_fffffffffffffa58;
            fmt.data_ = in_stack_fffffffffffffa50;
            local_470 = local_c0;
            ::fmt::v11::vformat_abi_cxx11_(fmt,in_stack_fffffffffffffa40);
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff7e0);
          }
        }
        else if (local_4cc[0] < 1) {
          local_658 = "[{}]value {}=block[{}]";
          local_650 = 0x16;
          local_660 = TimeRepresentation::operator_cast_to_double
                                ((TimeRepresentation<count_time<9,_long>_> *)0x2122a9);
          psVar6 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffff7e0);
          local_668 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                (&local_540);
          local_280 = local_648;
          local_290 = local_658;
          uStack_288 = local_650;
          local_298 = &local_660;
          local_2a8 = &local_668;
          local_2b8 = local_658;
          uStack_2b0 = local_650;
          local_120 = local_660;
          local_118 = local_2f8;
          local_2f8[0] = local_660;
          local_2a0 = psVar6;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff7f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e8);
          local_88 = local_2d8;
          local_90 = *local_2a8;
          local_28 = &local_2c8;
          local_30 = local_2f8;
          local_2c8 = 0x4da;
          fmt_02.size_ = (size_t)in_stack_fffffffffffffa58;
          fmt_02.data_ = in_stack_fffffffffffffa50;
          local_50 = local_90;
          local_48 = local_88;
          local_2d8[0] = local_90;
          local_2c0 = local_30;
          ::fmt::v11::vformat_abi_cxx11_(fmt_02,in_stack_fffffffffffffa40);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e0);
        }
        else {
          local_618 = "[{}:{}]value {}=block[{}]";
          local_610 = 0x19;
          local_620 = TimeRepresentation::operator_cast_to_double
                                ((TimeRepresentation<count_time<9,_long>_> *)0x21205f);
          psVar6 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffff7e0);
          local_628 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                (&local_540);
          local_300 = local_608;
          local_310 = local_618;
          uStack_308 = local_610;
          local_318 = &local_620;
          local_320 = local_4cc;
          local_330 = &local_628;
          local_348 = local_618;
          uStack_340 = local_610;
          local_110 = local_620;
          local_108 = local_398;
          local_398[0] = local_620;
          local_d8 = local_388;
          local_328 = psVar6;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff7f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e8);
          local_78 = local_368;
          local_80 = *local_330;
          local_68 = &local_358;
          local_70 = local_398;
          local_358 = 0x4d1a;
          fmt_01.size_ = (size_t)in_stack_fffffffffffffa58;
          fmt_01.data_ = in_stack_fffffffffffffa50;
          local_60 = local_80;
          local_58 = local_78;
          local_368[0] = local_80;
          local_350 = local_70;
          ::fmt::v11::vformat_abi_cxx11_(fmt_01,in_stack_fffffffffffffa40);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=(in_stack_fffffffffffff830,in_stack_fffffffffffff828);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e0);
        }
        spdlog::info<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x212493);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7e0);
      }
      pvVar7 = CLI::std::
               vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
               ::operator[]((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                             *)(in_RDI + 0x268),(long)local_544);
      if (pvVar7->cnt == 0) {
        pvVar4 = CLI::std::
                 vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
                 ::back((vector<helics::apps::Recorder::ValueCapture,_std::allocator<helics::apps::Recorder::ValueCapture>_>
                         *)in_stack_fffffffffffff7e0);
        pvVar4->first = true;
      }
      pvVar7 = CLI::std::
               vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
               ::operator[]((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                             *)(in_RDI + 0x268),(long)local_544);
      pvVar7->cnt = pvVar7->cnt + 1;
      CLI::std::
      vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
      ::operator[]((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                    *)(in_RDI + 0x268),(long)local_544);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffff7e0,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                in_stack_fffffffffffff7d8);
      CLI::std::
      vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
      ::operator[]((vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
                    *)(in_RDI + 0x268),(long)local_544);
      TimeRepresentation<count_time<9,_long>_>::operator=
                ((TimeRepresentation<count_time<9,_long>_> *)in_stack_fffffffffffff7e0,
                 (double)in_stack_fffffffffffff7d8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff7e0);
    }
    CLI::std::_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*>::operator++
              ((_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*> *)
               in_stack_fffffffffffff7e0);
  }
  local_670 = in_RDI + 0x138;
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::begin
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)in_stack_fffffffffffff7d8
            );
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::end
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)in_stack_fffffffffffff7d8
            );
  sVar11._M_str = (char *)in_stack_fffffffffffff828;
  sVar11._M_len = (size_t)in_stack_fffffffffffff830;
  while( true ) {
    bVar1 = CLI::std::operator==(&local_690,&local_6b0);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_6b8 = CLI::std::_Deque_iterator<helics::Endpoint,_helics::Endpoint_&,_helics::Endpoint_*>
                ::operator*(&local_690);
    while( true ) {
      bVar1 = Endpoint::hasMessage(in_stack_fffffffffffff7e0);
      if (!bVar1) break;
      Endpoint::getMessage((Endpoint *)in_stack_fffffffffffff7e8);
      if ((*(byte *)(in_RDI + 0xa1) & 1) != 0) {
        std::__cxx11::string::string(in_stack_fffffffffffff7f0);
        pMVar8 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                 operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                            0x21265d);
        sVar9 = SmallBuffer::size(&pMVar8->data);
        if (sVar9 < 0x32) {
          local_710 = "[{}]message from {} to {}::{}";
          local_708[0]._M_allocated_capacity = 0x1d;
          local_718._M_p =
               (pointer)TimeRepresentation::operator_cast_to_double
                                  ((TimeRepresentation<count_time<9,_long>_> *)0x2126a7);
          pMVar8 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x2126c2);
          pMVar10 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                    operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *
                               )0x2126d7);
          psVar6 = &pMVar10->dest;
          CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x2126ea)
          ;
          sVar11 = SmallBuffer::to_string((SmallBuffer *)0x2126f6);
          local_1e0 = local_708[0]._M_local_buf + 8;
          local_1f0 = local_710;
          sStack_1e8 = local_708[0]._M_allocated_capacity;
          local_1f8 = &local_718;
          local_210 = &local_728;
          local_228 = local_710;
          sStack_220 = local_708[0]._M_allocated_capacity;
          local_130 = local_718._M_p;
          local_128 = local_278;
          local_278[0] = local_718._M_p;
          local_208 = psVar6;
          local_200 = &pMVar8->source;
          local_728 = sVar11;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff7f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e8);
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff7f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e8);
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff7f0,
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff7e8);
          local_18 = &local_238;
          local_20 = local_278;
          local_238 = 0xddda;
          fmt_03.size_ = (size_t)in_stack_fffffffffffffa58;
          fmt_03.data_ = in_stack_fffffffffffffa50;
          local_230 = local_20;
          ::fmt::v11::vformat_abi_cxx11_(fmt_03,in_stack_fffffffffffffa40);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    sVar11._M_len,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    sVar11._M_str);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e0);
        }
        else {
          local_758._M_p = "[{}]message from {} to {}:: size {}";
          local_750 = 0x23;
          local_760 = TimeRepresentation::operator_cast_to_double
                                ((TimeRepresentation<count_time<9,_long>_> *)0x2128f6);
          pMVar8 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x212911);
          in_stack_fffffffffffff7f0 = &pMVar8->source;
          pMVar8 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x212926);
          psVar6 = &pMVar8->dest;
          pMVar8 = CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x212939);
          local_770._8_8_ = SmallBuffer::size(&pMVar8->data);
          local_148 = local_748;
          local_158 = local_758._M_p;
          sStack_150 = local_750;
          local_160 = &local_760;
          local_178 = (undefined8 *)(local_770 + 8);
          local_188 = local_758._M_p;
          sStack_180 = local_750;
          local_140 = local_760;
          local_138 = local_1d8;
          local_1d8[0] = local_760;
          local_170 = psVar6;
          local_168 = in_stack_fffffffffffff7f0;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff7f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e8);
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff7f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e8);
          local_98 = local_1a8;
          local_a0 = *local_178;
          local_8 = &local_198;
          local_10 = local_1d8;
          local_198 = 0x4dda;
          fmt_04.size_ = (size_t)in_stack_fffffffffffffa58;
          fmt_04.data_ = in_stack_fffffffffffffa50;
          local_40 = local_a0;
          local_38 = local_98;
          local_1a8[0] = local_a0;
          local_190 = local_10;
          ::fmt::v11::vformat_abi_cxx11_(fmt_04,in_stack_fffffffffffffa40);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    sVar11._M_len,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    sVar11._M_str);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff7e0);
        }
        spdlog::info<std::__cxx11::string>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x212b30);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff7e0);
      }
      CLI::std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::push_back((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                   *)in_stack_fffffffffffff7e0,(value_type *)in_stack_fffffffffffff7d8);
      CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffff7e0);
    }
    CLI::std::_Deque_iterator<helics::Endpoint,_helics::Endpoint_&,_helics::Endpoint_*>::operator++
              ((_Deque_iterator<helics::Endpoint,_helics::Endpoint_&,_helics::Endpoint_*> *)
               in_stack_fffffffffffff7e0);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)
                     0x212bbd);
  if (bVar1) {
    while( true ) {
      CLI::std::unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_>::operator->
                ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)0x212bdc);
      bVar1 = Endpoint::hasMessage(in_stack_fffffffffffff7e0);
      if (!bVar1) break;
      in_stack_fffffffffffff7e0 = (Endpoint *)(in_RDI + 400);
      CLI::std::unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_>::operator->
                ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)0x212c0c);
      Endpoint::getMessage((Endpoint *)local_770);
      CLI::std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::push_back((vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                   *)in_stack_fffffffffffff7e0,(value_type *)in_stack_fffffffffffff7d8);
      CLI::std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffff7e0);
    }
  }
  return;
}

Assistant:

void Recorder::captureForCurrentTime(Time currentTime, int iteration)
{
    for (auto& sub : subscriptions) {
        if (sub.isUpdated()) {
            auto val = sub.getValue<std::string>();
            const int subId = subids[sub.getHandle()];
            points.emplace_back(currentTime, subId, val);
            if (iteration > 0) {
                points.back().iteration = iteration;
            }
            if (verbose) {
                std::string valstr;
                if (val.size() < 150) {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val);
                    } else {
                        valstr = fmt::format("[{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val);
                    }
                } else {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val.size());
                    } else {
                        valstr = fmt::format("[{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val.size());
                    }
                }
                spdlog::info(valstr);
            }
            if (vStat[subId].cnt == 0) {
                points.back().first = true;
            }
            ++vStat[subId].cnt;
            vStat[subId].lastVal = val;
            vStat[subId].time = -1.0;
        }
    }

    for (auto& ept : endpoints) {
        while (ept.hasMessage()) {
            auto mess = ept.getMessage();
            if (verbose) {
                std::string messstr;
                if (mess->data.size() < 50) {
                    messstr = fmt::format("[{}]message from {} to {}::{}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->dest,
                                          mess->data.to_string());
                } else {
                    messstr = fmt::format("[{}]message from {} to {}:: size {}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->dest,
                                          mess->data.size());
                }
                spdlog::info(messstr);
            }
            messages.push_back(std::move(mess));
        }
    }
    // get the clone endpoints
    if (cloneEndpoint) {
        while (cloneEndpoint->hasMessage()) {
            messages.push_back(cloneEndpoint->getMessage());
        }
    }
}